

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O0

void __thiscall
btRigidBody::btRigidBody
          (btRigidBody *this,btScalar mass,btMotionState *motionState,
          btCollisionShape *collisionShape,btVector3 *localInertia)

{
  btCollisionShape *in_RDI;
  btRigidBodyConstructionInfo cinfo;
  void **this_00;
  btMatrix3x3 *in_stack_ffffffffffffff30;
  btScalar in_stack_ffffffffffffff3c;
  btRigidBodyConstructionInfo *in_stack_ffffffffffffff40;
  btCollisionObject *in_stack_ffffffffffffff50;
  btRigidBodyConstructionInfo *in_stack_ffffffffffffffa8;
  btRigidBody *in_stack_ffffffffffffffb0;
  
  btCollisionObject::btCollisionObject(in_stack_ffffffffffffff50);
  in_RDI->_vptr_btCollisionShape = (_func_int **)&PTR__btRigidBody_002e7a80;
  btMatrix3x3::btMatrix3x3(in_stack_ffffffffffffff30);
  btVector3::btVector3((btVector3 *)&in_RDI[0xb].field_0x1c);
  btVector3::btVector3((btVector3 *)&in_RDI[0xc].field_0xc);
  btVector3::btVector3((btVector3 *)(in_RDI + 0xd));
  btVector3::btVector3((btVector3 *)&in_RDI[0xd].m_userPointer);
  btVector3::btVector3((btVector3 *)(in_RDI + 0xe));
  btVector3::btVector3((btVector3 *)&in_RDI[0xe].m_userPointer);
  btVector3::btVector3((btVector3 *)(in_RDI + 0xf));
  btVector3::btVector3((btVector3 *)&in_RDI[0xf].m_userPointer);
  this_00 = &in_RDI[0x11].m_userPointer;
  btAlignedObjectArray<btTypedConstraint_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btTypedConstraint_*> *)this_00);
  btVector3::btVector3((btVector3 *)&in_RDI[0x12].m_userIndex);
  btVector3::btVector3((btVector3 *)&in_RDI[0x13].m_shapeType);
  btVector3::btVector3((btVector3 *)&in_RDI[0x13].m_userIndex);
  btVector3::btVector3((btVector3 *)&in_RDI[0x14].m_shapeType);
  btVector3::btVector3((btVector3 *)&in_RDI[0x14].m_userIndex);
  btVector3::btVector3((btVector3 *)&in_RDI[0x15].m_shapeType);
  btRigidBodyConstructionInfo::btRigidBodyConstructionInfo
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
             (btMotionState *)in_stack_ffffffffffffff30,in_RDI,(btVector3 *)this_00);
  setupRigidBody(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

btRigidBody::btRigidBody(btScalar mass, btMotionState *motionState, btCollisionShape *collisionShape, const btVector3 &localInertia)
{
	btRigidBodyConstructionInfo cinfo(mass,motionState,collisionShape,localInertia);
	setupRigidBody(cinfo);
}